

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingRush.cpp
# Opt level: O2

int shopping<std::multiset<std::pair<MarketProduct,int>,std::less<std::pair<MarketProduct,int>>,std::allocator<std::pair<MarketProduct,int>>>>
              (timed_mutex *buy_mx,
              multiset<std::pair<MarketProduct,_int>,_std::less<std::pair<MarketProduct,_int>_>,_std::allocator<std::pair<MarketProduct,_int>_>_>
              *shop,string *shopname,int *budget,int threadid)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  iterator elit;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  unique_lock<std::timed_mutex> buy_lock;
  
  do {
    uVar1 = (shop->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (uVar1 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,threadid);
      pcVar5 = "] no more products in this shop";
LAB_00103ad8:
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      return 0;
    }
    elit._M_node = (shop->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar3 = rand();
    std::__advance<std::_Rb_tree_const_iterator<std::pair<MarketProduct,int>>,long>
              (&elit,(ulong)(long)iVar3 % uVar1);
    iVar3 = *budget - *(int *)&elit._M_node[1].field_0x4;
    if (iVar3 == 0 || *budget < *(int *)&elit._M_node[1].field_0x4) {
      poVar4 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,threadid);
      pcVar5 = "] budget exhausted";
      goto LAB_00103ad8;
    }
    *budget = iVar3;
    buy_lock._M_owns = false;
    local_48.__r = 100;
    buy_lock._M_device = buy_mx;
    bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                      (&buy_lock,&local_48);
    if (bVar2) {
      std::
      _Rb_tree<std::pair<MarketProduct,int>,std::pair<MarketProduct,int>,std::_Identity<std::pair<MarketProduct,int>>,std::less<std::pair<MarketProduct,int>>,std::allocator<std::pair<MarketProduct,int>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<MarketProduct,int>,std::pair<MarketProduct,int>,std::_Identity<std::pair<MarketProduct,int>>,std::less<std::pair<MarketProduct,int>>,std::allocator<std::pair<MarketProduct,int>>>
                          *)shop,(const_iterator)elit._M_node);
      poVar4 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,threadid);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)shopname);
      poVar4 = std::operator<<(poVar4,"] bought item, new budget ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*budget);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,threadid);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)shopname);
      poVar4 = std::operator<<(poVar4,"] timeout");
    }
    std::endl<char,std::char_traits<char>>(poVar4);
    std::unique_lock<std::timed_mutex>::~unique_lock(&buy_lock);
    if (!bVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

int shopping(std::timed_mutex& buy_mx, shop_t& shop,
             const std::string& shopname, int& budget, const int threadid) {
  bool checkout = false;

  while (!checkout) {
    // try to buy things, but only if shop is not empty

    size_t size = shop.size();
    if (size != 0) {
      auto elit = shop.begin();
      // find random product in shop
      std::advance(elit, (std::rand() % size));
      if (std::get<1>(*elit) < budget) {
        budget -= std::get<1>(*elit);

        // be careful, erase modifies the shop, hence lock here
        std::unique_lock<std::timed_mutex> buy_lock(buy_mx, std::defer_lock);

        if (!buy_lock.try_lock_for(std::chrono::milliseconds(PATIENCE))) {
          std::cout << "[T " << threadid << ", " << shopname << "] timeout"
                    << std::endl;
          return TIMEOUT;
        }
        // remove item from shop
        shop.erase(elit);
        std::cout << "[T " << threadid << ", " << shopname
                  << "] bought item, new budget " << budget << std::endl;
      } else {
        std::cout << "[T " << threadid << "] budget exhausted" << std::endl;
        checkout = true;
      }
    } else {
      std::cout << "[T " << threadid << "] no more products in this shop"
                << std::endl;
      checkout = true;
    }
  }
  return CHECKOUT;
}